

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uint64 value,uint8 *target)

{
  uint8 *puVar1;
  uint8 *target_local;
  uint64 value_local;
  ulong local_18;
  uint8 *local_10;
  
  if (value < 0x80) {
    *target = (byte)value;
    local_10 = target + 1;
  }
  else {
    *target = (byte)value | 0x80;
    local_18 = value >> 7;
    if (local_18 < 0x80) {
      target[1] = (uint8)local_18;
      local_10 = target + 2;
    }
    else {
      puVar1 = target + 1;
      do {
        value_local = (uint64)puVar1;
        *(byte *)value_local = (byte)local_18 | 0x80;
        local_18 = local_18 >> 7;
        puVar1 = (undefined1 *)(value_local + 1);
      } while (0x7f < local_18);
      local_10 = (uint8 *)(value_local + 2);
      *(undefined1 *)(value_local + 1) = (char)local_18;
    }
  }
  return local_10;
}

Assistant:

inline uint8* CodedOutputStream::WriteVarint64ToArray(uint64 value,
                                                      uint8* target) {
  return EpsCopyOutputStream::UnsafeVarint(value, target);
}